

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhttpmultipart.cpp
# Opt level: O2

void __thiscall QHttpPartPrivate::checkHeaderCreated(QHttpPartPrivate *this)

{
  qsizetype qVar1;
  qsizetype i;
  long i_00;
  long in_FS_OFFSET;
  QLatin1StringView QVar2;
  QHttpHeaders h;
  QStringBuilder<QStringBuilder<QStringBuilder<QByteArrayView,_const_char_(&)[3]>,_QByteArrayView>,_const_char_(&)[3]>
  local_70;
  QHttpHeaders local_40;
  pair<QByteArray,_QByteArray> *local_38;
  
  local_38 = *(pair<QByteArray,_QByteArray> **)(in_FS_OFFSET + 0x28);
  if (this->headerCreated == false) {
    local_40.d.d.ptr = (QExplicitlySharedDataPointer<QHttpHeadersPrivate>)&DAT_aaaaaaaaaaaaaaaa;
    QNetworkHeadersPrivate::headers((QNetworkHeadersPrivate *)&stack0xffffffffffffffc0);
    i_00 = 0;
    while( true ) {
      qVar1 = QHttpHeaders::size(&stack0xffffffffffffffc0);
      if (qVar1 <= i_00) break;
      QVar2 = QHttpHeaders::nameAt(&stack0xffffffffffffffc0,i_00);
      local_70.a.b = QHttpHeaders::valueAt(&stack0xffffffffffffffc0,i_00);
      local_70.a.a.b = (char (*) [3])0x25f9e5;
      local_70.b = (char (*) [3])0x24e55a;
      local_70.a.a.a = (QByteArrayView)QVar2;
      ::operator+=(&this->header,&local_70);
      i_00 = i_00 + 1;
    }
    QByteArray::append(&this->header,"\r\n");
    this->headerCreated = true;
    QHttpHeaders::~QHttpHeaders(&stack0xffffffffffffffc0);
  }
  if (*(pair<QByteArray,_QByteArray> **)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QHttpPartPrivate::checkHeaderCreated() const
{
    if (!headerCreated) {
        // copied from QHttpNetworkRequestPrivate::header() and adapted
        const auto h = headers();
        for (qsizetype i = 0; i < h.size(); ++i) {
            const auto name = h.nameAt(i);
            header += QByteArrayView(name.data(), name.size()) + ": " + h.valueAt(i) + "\r\n";
        }

        header += "\r\n";
        headerCreated = true;
    }
}